

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::analysis::Function::str_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  ostringstream oss;
  string asStack_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar4 = (long)(this->param_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->param_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  pcVar1 = "Number of (literal, label) pairs in OpSwitch (";
  lVar3 = 0;
  do {
    std::operator<<((ostream *)local_1a8,pcVar1 + 0x2d);
    do {
      if (lVar4 == lVar3) {
        poVar2 = std::operator<<((ostream *)local_1a8,") -> ");
        (*this->return_type_->_vptr_Type[3])(asStack_1c8);
        std::operator<<(poVar2,asStack_1c8);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        return __return_storage_ptr__;
      }
      (*(this->param_types_).
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar3]->_vptr_Type[3])(asStack_1c8);
      std::operator<<((ostream *)local_1a8,asStack_1c8);
      std::__cxx11::string::_M_dispose();
      lVar3 = lVar3 + 1;
    } while (lVar4 == lVar3);
    pcVar1 = "or 0 for an integer type with Signedness of 0, ";
  } while( true );
}

Assistant:

std::string Function::str() const {
  std::ostringstream oss;
  const size_t count = param_types_.size();
  oss << "(";
  for (size_t i = 0; i < count; ++i) {
    oss << param_types_[i]->str();
    if (i + 1 != count) oss << ", ";
  }
  oss << ") -> " << return_type_->str();
  return oss.str();
}